

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall jrtplib::RTPSession::SetLocalName(RTPSession *this,void *s,size_t len)

{
  int status;
  size_t len_local;
  void *s_local;
  RTPSession *this_local;
  
  if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x3e;
  }
  else {
    this_local._4_4_ = RTCPPacketBuilder::SetLocalName(&this->rtcpbuilder,s,len);
  }
  return this_local._4_4_;
}

Assistant:

int RTPSession::SetLocalName(const void *s,size_t len)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;
	BUILDER_LOCK
	status = rtcpbuilder.SetLocalName(s,len);
	BUILDER_UNLOCK
	return status;
}